

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase35::run(TestCase35 *this)

{
  Builder builder_00;
  Builder builder_01;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  bool bVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  word *data;
  size_t sVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  MessageSize MVar5;
  ReaderOptions options;
  undefined8 in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  Reader local_480;
  uint64_t local_450;
  uint local_448;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_440;
  unsigned_long local_430;
  bool local_421;
  undefined1 local_420 [7];
  bool _kj_shouldLog;
  uint64_t local_3f0;
  uint local_3e8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_3e0;
  unsigned_long local_3d0;
  DebugExpression<unsigned_long> local_3c8;
  undefined1 local_3c0 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_1;
  Reader local_388;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_358;
  size_t local_348;
  uint local_33c;
  Fault local_338;
  Fault f;
  size_t local_320;
  uint local_318;
  DebugExpression<unsigned_int> local_314;
  undefined1 local_310 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  ReaderOptions local_2b8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_2a8;
  undefined1 local_298 [8];
  SegmentArrayMessageReader reader;
  Reader local_190;
  Builder local_160;
  Builder local_128;
  undefined1 local_100 [8];
  MallocMessageBuilder builder;
  TestCase35 *this_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)this;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_128,(MessageBuilder *)local_100);
  builder_00._builder.capTable = (CapTableBuilder *)local_128._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_128._builder.capTable;
  builder_00._builder.data = local_128._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_128._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffa90;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffa90 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffa90 >> 0x30);
  initTestMessage(builder_00);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_160,(MessageBuilder *)local_100);
  builder_01._builder.capTable = (CapTableBuilder *)local_160._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_160._builder.capTable;
  builder_01._builder.data = local_160._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_160._builder._32_8_;
  builder_01._builder.dataSize = (int)in_stack_fffffffffffffa90;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffa90 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffa90 >> 0x30);
  checkTestMessage(builder_01);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&reader.segments.size_,(MessageBuilder *)local_100);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            (&local_190,(Builder *)&reader.segments.size_);
  reader_00._reader.capTable = (CapTableReader *)local_190._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_190._reader.capTable;
  reader_00._reader.data = local_190._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_190._reader._32_8_;
  reader_00._reader.dataSize = local_190._reader.nestingLimit;
  reader_00._reader.pointerCount = local_190._reader._44_2_;
  reader_00._reader._38_2_ = local_190._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffa98;
  checkTestMessage(reader_00);
  local_2a8 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
  local_2b8.traversalLimitInWords = 0;
  local_2b8.nestingLimit = 0;
  local_2b8._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_2b8);
  options.nestingLimit = local_2b8.nestingLimit;
  options.traversalLimitInWords = local_2b8.traversalLimitInWords;
  options._12_4_ = 0;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_298,local_2a8,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Reader *)&_kjCondition.result,(MessageReader *)local_298);
  reader_01._reader.capTable = (CapTableReader *)local_2d8;
  reader_01._reader.segment = (SegmentReader *)uStack_2e0;
  reader_01._reader.data = (void *)uStack_2d0;
  reader_01._reader.pointers = (WirePointer *)local_2c8;
  reader_01._reader._32_8_ = uStack_2c0;
  reader_01._reader._40_8_ = in_stack_fffffffffffffa98;
  checkTestMessage(reader_01);
  local_318 = 1;
  local_314 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_318);
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
  f.exception = (Exception *)AVar4.ptr;
  local_320 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_310,&local_314,&local_320);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_310);
  if (bVar1) {
    AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
    _kjCondition_1._32_8_ = AVar4.ptr;
    pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition_1.result,0
                       );
    data = kj::ArrayPtr<const_capnp::word>::begin(pAVar2);
    readMessageUnchecked<capnproto_test::capnp::test::TestAllTypes>(&local_388,data);
    reader_02._reader.capTable = (CapTableReader *)local_388._reader.data;
    reader_02._reader.segment = (SegmentReader *)local_388._reader.capTable;
    reader_02._reader.data = local_388._reader.pointers;
    reader_02._reader.pointers = (WirePointer *)local_388._reader._32_8_;
    reader_02._reader.dataSize = local_388._reader.nestingLimit;
    reader_02._reader.pointerCount = local_388._reader._44_2_;
    reader_02._reader._38_2_ = local_388._reader._46_2_;
    reader_02._reader._40_8_ = in_stack_fffffffffffffa98;
    checkTestMessage(reader_02);
    local_3e0 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
    pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_3e0,0);
    sVar3 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
    local_3d0 = sVar3 - 1;
    local_3c8 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3d0);
    MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
              ((Reader *)local_420,(MessageReader *)local_298);
    MVar5 = capnproto_test::capnp::test::TestAllTypes::Reader::totalSize((Reader *)local_420);
    local_3f0 = MVar5.wordCount;
    local_3e8 = MVar5.capCount;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_unsigned_long> *)local_3c0,&local_3c8,&local_3f0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3c0);
    if (!bVar1) {
      local_421 = kj::_::Debug::shouldLog(ERROR);
      while (local_421 != false) {
        AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
        local_440 = AVar4;
        pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_440,0);
        sVar3 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
        local_430 = sVar3 - 1;
        MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
                  (&local_480,(MessageReader *)local_298);
        MVar5 = capnproto_test::capnp::test::TestAllTypes::Reader::totalSize(&local_480);
        local_450 = MVar5.wordCount;
        local_448 = MVar5.capCount;
        kj::_::Debug::
        log<char_const(&)[122],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x33,ERROR,
                   "\"failed: expected \" \"(builder.getSegmentsForOutput()[0].size() - 1) == (reader.getRoot<TestAllTypes>().totalSize().wordCount)\", _kjCondition, builder.getSegmentsForOutput()[0].size() - 1, reader.getRoot<TestAllTypes>().totalSize().wordCount"
                   ,(char (*) [122])
                    "failed: expected (builder.getSegmentsForOutput()[0].size() - 1) == (reader.getRoot<TestAllTypes>().totalSize().wordCount)"
                   ,(DebugComparison<unsigned_long,_unsigned_long> *)local_3c0,&local_430,&local_450
                  );
        local_421 = false;
      }
    }
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_298);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_100);
    return;
  }
  local_33c = 1;
  local_358 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
  local_348 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size(&local_358);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&local_338,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x2e,FAILED,"(1u) == (builder.getSegmentsForOutput().size())",
             "_kjCondition,1u, builder.getSegmentsForOutput().size()",
             (DebugComparison<unsigned_int,_unsigned_long> *)local_310,&local_33c,&local_348);
  kj::_::Debug::Fault::fatal(&local_338);
}

Assistant:

TEST(Encoding, AllTypes) {
  MallocMessageBuilder builder;

  initTestMessage(builder.initRoot<TestAllTypes>());
  checkTestMessage(builder.getRoot<TestAllTypes>());
  checkTestMessage(builder.getRoot<TestAllTypes>().asReader());

  SegmentArrayMessageReader reader(builder.getSegmentsForOutput());

  checkTestMessage(reader.getRoot<TestAllTypes>());

  ASSERT_EQ(1u, builder.getSegmentsForOutput().size());

  checkTestMessage(readMessageUnchecked<TestAllTypes>(builder.getSegmentsForOutput()[0].begin()));

  EXPECT_EQ(builder.getSegmentsForOutput()[0].size() - 1,  // -1 for root pointer
            reader.getRoot<TestAllTypes>().totalSize().wordCount);
}